

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_color_quantity.cpp
# Opt level: O3

void __thiscall
polyscope::VolumeMeshVertexColorQuantity::VolumeMeshVertexColorQuantity
          (VolumeMeshVertexColorQuantity *this,string *name,VolumeMesh *mesh_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *values_)

{
  pointer pcVar1;
  string local_68;
  string local_48;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"vertex","");
  VolumeMeshColorQuantity::VolumeMeshColorQuantity
            (&this->super_VolumeMeshColorQuantity,&local_48,mesh_,&local_68,values_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  (this->super_VolumeMeshColorQuantity).super_VolumeMeshQuantity.
  super_QuantityS<polyscope::VolumeMesh>.super_Quantity._vptr_Quantity =
       (_func_int **)&PTR__VolumeMeshColorQuantity_005f5a08;
  VolumeMesh::refreshVolumeMeshListeners
            ((this->super_VolumeMeshColorQuantity).super_VolumeMeshQuantity.
             super_QuantityS<polyscope::VolumeMesh>.parent);
  return;
}

Assistant:

VolumeMeshVertexColorQuantity::VolumeMeshVertexColorQuantity(std::string name, VolumeMesh& mesh_,
                                                             const std::vector<glm::vec3>& values_)
    : VolumeMeshColorQuantity(name, mesh_, "vertex", values_)

{
  parent.refreshVolumeMeshListeners(); // just in case this quantity is being drawn
}